

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture3DView *src,float *texCoord,ReferenceParams *params)

{
  Sampler *sampler;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ulong uVar7;
  byte bVar8;
  LodMode mode;
  bool bVar9;
  ulong uVar10;
  undefined4 uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ConstPixelBufferAccess *pCVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar27;
  undefined4 extraout_XMM0_Dc;
  float fVar28;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  float fVar49;
  Texture3DView TVar50;
  Vec3 triT [2];
  Vec3 triS [2];
  Vec3 triR [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture3DView view;
  float local_298;
  float local_280;
  Vec3 local_278;
  Vec3 local_26c;
  Vec3 local_258;
  Vec3 local_24c;
  Vec3 local_238;
  Vec3 local_22c;
  undefined1 local_218 [16];
  float local_1fc;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_1a8;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  float local_f8 [4];
  undefined8 local_e8;
  IVec3 local_d8;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float local_b8 [4];
  undefined8 local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  Texture3DView local_78;
  float local_68 [4];
  undefined8 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  TVar50 = getSubView((TextureTestUtil *)(ulong)(uint)src->m_numLevels,
                      (Texture3DView *)src->m_levels,params->baseLevel,params->maxLevel);
  local_78.m_levels = TVar50.m_levels;
  local_78.m_numLevels = TVar50.m_numLevels;
  local_218 = ZEXT416((uint)*texCoord);
  local_158 = ZEXT416((uint)texCoord[1]);
  local_168 = ZEXT416((uint)texCoord[3]);
  local_178 = ZEXT416((uint)texCoord[6]);
  fVar22 = texCoord[9];
  local_128 = ZEXT416((uint)texCoord[4]);
  local_148 = ZEXT416((uint)texCoord[7]);
  local_1c8 = ZEXT416((uint)texCoord[10]);
  local_138 = ZEXT416((uint)texCoord[2]);
  _local_1b8 = ZEXT416((uint)texCoord[5]);
  _local_108 = ZEXT416((uint)texCoord[8]);
  _local_118 = ZEXT416((uint)texCoord[0xb]);
  sampler = &params->sampler;
  if (((params->super_RenderParams).flags & 1) == 0) {
    local_1a8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar50 = tcu::getEffectiveTextureView(&local_78,&local_1a8,sampler);
    pCVar16 = TVar50.m_levels;
    local_188._0_4_ = TVar50.m_numLevels;
    local_88._0_8_ = 0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_88._0_8_ = ZEXT48((uint)(params->super_RenderParams).bias);
    }
    local_88._8_8_ = 0;
    mode = dst->m_width;
    local_98 = (float)dst->m_height;
    if (TVar50.m_numLevels < 1) {
      local_d8.m_data[0] = 0;
      local_d8.m_data[1] = 0;
      local_d8.m_data[2] = 0;
    }
    else {
      local_d8.m_data._0_8_ = *(undefined8 *)(pCVar16->m_size).m_data;
      local_d8.m_data[2] = (pCVar16->m_size).m_data[2];
    }
    local_258.m_data[0] = (float)local_218._0_4_;
    local_258.m_data[1] = (float)local_168._0_4_;
    local_258.m_data[2] = (float)local_178._0_4_;
    local_24c.m_data[1] = (float)local_178._0_4_;
    local_24c.m_data[2] = (float)local_168._0_4_;
    local_278.m_data[0] = (float)local_158._0_4_;
    local_278.m_data[1] = (float)local_128._0_4_;
    local_278.m_data[2] = (float)local_148._0_4_;
    local_26c.m_data[0] = (float)local_1c8._0_4_;
    local_26c.m_data[1] = (float)local_148._0_4_;
    local_26c.m_data[2] = (float)local_128._0_4_;
    local_238.m_data[0] = (float)local_138._0_4_;
    local_238.m_data[1] = (float)local_1b8._0_4_;
    local_238.m_data[2] = (float)local_108._0_4_;
    local_22c.m_data[0] = (float)local_118._0_4_;
    local_22c.m_data[1] = (float)local_108._0_4_;
    local_22c.m_data[2] = (float)local_1b8._0_4_;
    local_24c.m_data[0] = fVar22;
    local_1b8._0_4_ =
         computeNonProjectedTriLod
                   ((TextureTestUtil *)(ulong)params->lodMode,mode,(IVec2 *)(ulong)(uint)local_98,
                    &local_d8,&local_258,&local_278,&local_238);
    local_1b8._4_4_ = extraout_XMM0_Db;
    fStack_1b0 = (float)extraout_XMM0_Dc;
    fStack_1ac = (float)extraout_XMM0_Dd;
    uVar11 = params->minLod;
    local_218 = ZEXT416((uint)params->maxLod);
    fVar22 = computeNonProjectedTriLod
                       ((TextureTestUtil *)(ulong)params->lodMode,mode,
                        (IVec2 *)(ulong)(uint)local_98,&local_d8,&local_24c,&local_26c,&local_22c);
    auVar35._0_4_ = (float)local_1b8._0_4_ + (float)local_88._0_4_;
    auVar35._4_4_ = fVar22 + (float)local_88._0_4_;
    auVar35._8_4_ = (float)local_1b8._4_4_ + (float)local_88._0_4_;
    auVar35._12_4_ = extraout_XMM0_Db_00 + (float)local_88._0_4_;
    auVar34._4_4_ = params->maxLod;
    auVar34._0_4_ = local_218._0_4_;
    auVar34._8_4_ = local_218._4_4_;
    auVar34._12_4_ = 0;
    auVar34 = minps(auVar34,auVar35);
    uVar21 = -(uint)(auVar35._4_4_ < params->minLod);
    local_f8[0] = (float)(~-(uint)(auVar35._0_4_ < (float)uVar11) & auVar34._0_4_ |
                         uVar11 & -(uint)(auVar35._0_4_ < (float)uVar11));
    local_f8[1] = (float)(~uVar21 & auVar34._4_4_ | (uint)params->minLod & uVar21);
    iVar20 = dst->m_height;
    if (0 < iVar20) {
      iVar17 = dst->m_width;
      iVar18 = 0;
      auVar38._0_12_ = ZEXT812(0x3f800000);
      auVar38._12_4_ = 0;
      do {
        if (0 < iVar17) {
          iVar20 = 0;
          do {
            auVar25._0_4_ = (float)iVar20 + 0.5;
            auVar25._4_4_ = (float)iVar18 + 0.5;
            auVar25._8_8_ = 0;
            auVar31._0_4_ = (float)iVar17;
            auVar31._4_4_ = (float)dst->m_height;
            auVar31._8_8_ = 0;
            auVar26 = divps(auVar25,auVar31);
            fVar22 = auVar26._4_4_;
            fVar27 = auVar38._0_4_;
            bVar9 = fVar27 <= auVar26._0_4_ + fVar22;
            if (bVar9) {
              auVar26._0_4_ = fVar27 - auVar26._0_4_;
              auVar26._4_12_ = auVar38._4_12_;
              if (bVar9) goto LAB_018c081d;
LAB_018c082c:
              fVar28 = auVar26._0_4_;
            }
            else {
              if (!bVar9) goto LAB_018c082c;
LAB_018c081d:
              fVar28 = auVar26._0_4_;
              fVar22 = fVar27 - fVar22;
            }
            fVar27 = (&local_258)[bVar9].m_data[0];
            fVar29 = (&local_278)[bVar9].m_data[0];
            fVar32 = (&local_238)[bVar9].m_data[0];
            tcu::sampleLevelArray3D
                      ((tcu *)local_b8,pCVar16,local_188._0_4_,sampler,
                       ((&local_258)[bVar9].m_data[1] - fVar27) * fVar22 +
                       ((&local_24c)[(ulong)bVar9 - 1].m_data[2] - fVar27) * fVar28 + fVar27,
                       ((&local_278)[bVar9].m_data[1] - fVar29) * fVar22 +
                       ((&local_26c)[(ulong)bVar9 - 1].m_data[2] - fVar29) * fVar28 + fVar29,
                       ((&local_238)[bVar9].m_data[1] - fVar32) * fVar22 +
                       ((&local_22c)[(ulong)bVar9 - 1].m_data[2] - fVar32) * fVar28 + fVar32,
                       local_f8[bVar9]);
            fVar22 = (params->super_RenderParams).colorScale.m_data[0] * local_b8[0] +
                     (params->super_RenderParams).colorBias.m_data[0];
            fVar27 = (params->super_RenderParams).colorScale.m_data[1] * local_b8[1] +
                     (params->super_RenderParams).colorBias.m_data[1];
            fVar28 = (params->super_RenderParams).colorScale.m_data[2] * local_b8[2] +
                     (params->super_RenderParams).colorBias.m_data[2];
            fVar29 = (params->super_RenderParams).colorScale.m_data[3] * local_b8[3] +
                     (params->super_RenderParams).colorBias.m_data[3];
            bVar8 = dst->m_colorMask;
            uVar12 = 0;
            uVar21 = 0;
            if ((bVar8 & 1) != 0) {
              uVar13 = 0x7e - ((int)fVar22 >> 0x17);
              uVar21 = (((uint)fVar22 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar21 = uVar13;
              }
              uVar21 = uVar21 >> 0x18;
            }
            auVar38._0_12_ = ZEXT812(0x3f800000);
            auVar38._12_4_ = 0;
            if ((bVar8 & 2) != 0) {
              uVar13 = 0x7e - ((int)fVar27 >> 0x17);
              uVar12 = (((uint)fVar27 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar12 = uVar13;
              }
              uVar12 = uVar12 >> 0x10 & 0xff00;
            }
            uVar13 = 0;
            if ((bVar8 & 4) != 0) {
              uVar14 = 0x7e - ((int)fVar28 >> 0x17);
              uVar13 = (((uint)fVar28 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar14 & 0x1f)) +
                       0x800000;
              if (8 < uVar14) {
                uVar13 = uVar14;
              }
              uVar13 = uVar13 >> 8 & 0xff0000;
            }
            uVar14 = 0xff000000;
            if ((bVar8 & 8) != 0) {
              uVar15 = 0x7e - ((int)fVar29 >> 0x17);
              uVar14 = (((uint)fVar29 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                       0x800000;
              if (8 < uVar15) {
                uVar14 = uVar15;
              }
              uVar14 = uVar14 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)(dst->m_x + iVar20 + (dst->m_y + iVar18) * dst->m_surface->m_width) * 4)
                 = uVar12 | uVar21 | uVar13 | uVar14;
            iVar20 = iVar20 + 1;
            iVar17 = dst->m_width;
          } while (iVar20 < iVar17);
          iVar20 = dst->m_height;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar20);
    }
  }
  else {
    local_1a8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar50 = tcu::getEffectiveTextureView(&local_78,&local_1a8,sampler);
    pCVar16 = TVar50.m_levels;
    iVar20 = TVar50.m_numLevels;
    local_280 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_280 = (params->super_RenderParams).bias;
    }
    if (iVar20 < 1) {
      local_b8[0] = (float)local_218._0_4_ * 0.0;
      local_b8[1] = (float)local_168._0_4_ * 0.0;
      local_b8[2] = (float)local_178._0_4_ * 0.0;
      local_b8[3] = fVar22 * 0.0;
      fVar27 = 0.0;
    }
    else {
      local_b8[3] = (float)(pCVar16->m_size).m_data[0];
      local_b8[0] = local_b8[3] * (float)local_218._0_4_;
      local_b8[1] = local_b8[3] * (float)local_168._0_4_;
      local_b8[2] = local_b8[3] * (float)local_178._0_4_;
      local_b8[3] = local_b8[3] * fVar22;
      fVar27 = (float)(pCVar16->m_size).m_data[1];
    }
    iVar17 = dst->m_height;
    if (iVar20 < 1) {
      fVar28 = 0.0;
    }
    else {
      fVar28 = (float)(pCVar16->m_size).m_data[2];
    }
    iVar18 = dst->m_width;
    local_258.m_data[0] = (float)local_218._0_4_;
    local_258.m_data[1] = (float)local_168._0_4_;
    local_258.m_data[2] = (float)local_178._0_4_;
    local_24c.m_data[0] = fVar22;
    local_24c.m_data[1] = (float)local_178._0_4_;
    local_24c.m_data[2] = (float)local_168._0_4_;
    local_278.m_data[0] = (float)local_158._0_4_;
    local_278.m_data[1] = (float)local_128._0_4_;
    local_278.m_data[2] = (float)local_148._0_4_;
    local_26c.m_data[0] = (float)local_1c8._0_4_;
    local_26c.m_data[1] = (float)local_148._0_4_;
    local_26c.m_data[2] = (float)local_128._0_4_;
    local_238.m_data[0] = (float)local_138._0_4_;
    local_238.m_data[1] = (float)local_1b8._0_4_;
    local_238.m_data[2] = (float)local_108._0_4_;
    local_22c.m_data[0] = (float)local_118._0_4_;
    local_22c.m_data[1] = (float)local_108._0_4_;
    local_22c.m_data[2] = (float)local_1b8._0_4_;
    local_a8 = CONCAT44(local_b8[1],local_b8[2]);
    local_d8.m_data[1] = (int)(fVar27 * (float)local_128._0_4_);
    local_d8.m_data[0] = (int)(fVar27 * (float)local_158._0_4_);
    local_d8.m_data[2] = (int)(fVar27 * (float)local_148._0_4_);
    fStack_cc = fVar27 * (float)local_1c8._0_4_;
    local_c8 = fVar27 * (float)local_148._0_4_;
    fStack_c4 = fVar27 * (float)local_128._0_4_;
    local_f8[0] = fVar28 * (float)local_138._0_4_;
    local_f8[1] = fVar28 * (float)local_1b8._0_4_;
    local_f8[2] = fVar28 * (float)local_108._0_4_;
    local_f8[3] = fVar28 * (float)local_118._0_4_;
    local_e8 = CONCAT44(fVar28 * (float)local_1b8._0_4_,fVar28 * (float)local_108._0_4_);
    local_68[1] = (params->super_RenderParams).w.m_data[1];
    local_68[2] = (params->super_RenderParams).w.m_data[2];
    local_68[0] = (params->super_RenderParams).w.m_data[0];
    local_68[3] = (params->super_RenderParams).w.m_data[3];
    local_58 = CONCAT44(local_68[1],local_68[2]);
    if (0 < iVar17) {
      fVar22 = (float)iVar18;
      local_1fc = (float)iVar17;
      iVar19 = 0;
      local_1ec = fVar22;
      do {
        if (0 < iVar18) {
          local_1f0 = (float)iVar19 + 0.5;
          fVar27 = local_1f0 / local_1fc;
          local_1f4 = local_1fc - local_1f0;
          local_1f8 = 1.0 - fVar27;
          iVar17 = 0;
          do {
            auVar34 = local_178;
            local_178._4_4_ = (float)iVar17 + 0.5;
            fVar29 = (float)local_178._4_4_ / fVar22;
            bVar9 = 1.0 <= fVar27 + fVar29;
            local_1d4 = local_1f0;
            fVar28 = fVar27;
            if (bVar9) {
              local_178._4_4_ = fVar22 - (float)local_178._4_4_;
              fVar29 = 1.0 - fVar29;
              local_1d4 = local_1f4;
              fVar28 = local_1f8;
            }
            uVar10 = (ulong)bVar9;
            fVar32 = (1.0 - fVar29) - fVar28;
            auVar46._0_4_ = (&local_258)[uVar10].m_data[0] * fVar32;
            auVar45._0_4_ = (&local_24c)[uVar10 - 1].m_data[2] * fVar29;
            fVar22 = local_68[uVar10 * 3 + 2];
            uVar7 = *(ulong *)(local_68 + uVar10 * 3);
            local_128._8_8_ = 0;
            local_128._0_8_ = uVar7;
            auVar39._4_4_ = fVar32;
            auVar39._0_4_ = (&local_258)[uVar10].m_data[1] * fVar28;
            auVar39._8_8_ = 0;
            auVar46._4_4_ = fVar28;
            auVar46._8_8_ = 0;
            auVar36 = divps(auVar46,local_128);
            fVar41 = (float)uVar7;
            local_98 = (float)(uVar7 >> 0x20);
            auVar42._4_4_ = fVar41;
            auVar42._0_4_ = local_98;
            auVar42._8_8_ = 0;
            auVar40 = divps(auVar39,auVar42);
            auVar45._4_4_ = fVar29;
            auVar45._8_8_ = 0;
            fVar47 = fVar41 * local_98 * fVar22;
            local_88 = ZEXT416((uint)fVar22);
            auVar43._4_4_ = fVar22;
            auVar43._0_4_ = fVar22;
            auVar43._8_4_ = fVar22;
            auVar43._12_4_ = fVar22;
            auVar46 = divps(auVar45,auVar43);
            local_1b8._4_4_ = auVar46._4_4_ + auVar36._4_4_ + auVar40._4_4_;
            local_1b8._0_4_ =
                 (auVar46._0_4_ + auVar36._0_4_ + auVar40._0_4_) / (float)local_1b8._4_4_;
            fStack_1b0 = auVar46._8_4_ + auVar36._8_4_ + auVar40._8_4_;
            fStack_1ac = auVar46._12_4_ + auVar36._12_4_ + auVar40._12_4_;
            auVar48._0_4_ = (&local_278)[uVar10].m_data[0] * fVar32;
            auVar48._4_4_ = (&local_26c)[uVar10 - 1].m_data[2] * fVar29;
            auVar48._8_8_ = 0;
            auVar36._4_4_ = fVar22;
            auVar36._0_4_ = fVar41;
            auVar36._8_8_ = 0;
            auVar36 = divps(auVar48,auVar36);
            local_108._4_4_ = auVar36._4_4_;
            local_108._0_4_ =
                 ((float)local_108._4_4_ +
                 ((&local_278)[uVar10].m_data[1] * fVar28) / local_98 + auVar36._0_4_) /
                 (float)local_1b8._4_4_;
            fStack_100 = (float)local_108._4_4_;
            fStack_fc = (float)local_108._4_4_;
            auVar44._0_4_ = (&local_238)[uVar10].m_data[0] * fVar32;
            auVar44._4_4_ = (&local_22c)[uVar10 - 1].m_data[2] * fVar29;
            auVar44._8_8_ = 0;
            auVar40._4_4_ = fVar22;
            auVar40._0_4_ = fVar41;
            auVar40._8_8_ = 0;
            auVar36 = divps(auVar44,auVar40);
            local_118._4_4_ = auVar36._4_4_;
            fVar33 = (float)iVar18;
            local_118._0_4_ =
                 ((float)local_118._4_4_ +
                 (fVar28 * (&local_238)[uVar10].m_data[1]) / local_98 + auVar36._0_4_) /
                 (float)local_1b8._4_4_;
            fStack_110 = (float)local_118._4_4_;
            fStack_10c = (float)local_118._4_4_;
            fVar30 = (float)dst->m_height;
            fVar23 = local_1d4 / fVar30;
            local_188 = ZEXT416((uint)fVar23);
            fVar28 = local_b8[uVar10 * 3];
            fVar29 = local_b8[uVar10 * 3 + 1];
            fVar37 = fVar23 + -1.0;
            local_158 = ZEXT416((uint)fVar37);
            fVar24 = fVar33 * fVar37 + (float)local_178._4_4_;
            local_148 = ZEXT416((uint)fVar24);
            local_138._0_4_ = fVar47 * fVar33;
            local_138._4_4_ = local_98;
            local_138._8_8_ = 0;
            fVar32 = local_b8[uVar10 * 3 + 2];
            local_178._0_4_ = fVar32 - fVar29;
            local_178._8_8_ = auVar34._8_8_;
            local_168 = ZEXT816(0);
            fVar33 = (float)local_178._4_4_ / fVar33;
            local_1cc = fVar29 - fVar32;
            fVar1 = (float)(&local_d8)[uVar10].m_data[2];
            fVar2 = (float)(&local_d8)[uVar10].m_data[0];
            fVar3 = (float)(&local_d8)[uVar10].m_data[1];
            local_1d0 = fVar1 - fVar3;
            fVar4 = local_f8[uVar10 * 3 + 2];
            fVar5 = local_f8[uVar10 * 3];
            fVar6 = local_f8[uVar10 * 3 + 1];
            local_1e8 = (fVar3 - fVar2) * fVar22;
            local_1e4 = (fVar2 - fVar1) * local_98;
            local_218 = ZEXT416((uint)fVar33);
            fVar49 = fVar33 + -1.0;
            local_1e0 = (fVar32 - fVar28) * local_98;
            local_1dc = (fVar1 - fVar2) * local_98;
            local_1d8 = (fVar4 - fVar5) * local_98;
            fVar47 = fVar47 * fVar30;
            local_1c8._0_4_ = (fVar28 - fVar29) * fVar22;
            fVar24 = fVar24 * fVar22 * local_98 +
                     -fVar41 * (fVar23 * 0.0 + (float)local_178._4_4_ * local_98);
            fVar24 = fVar24 * fVar24;
            fVar30 = fVar22 * local_98 * (fVar30 * fVar49 + local_1d4) -
                     (local_98 * fVar30 * fVar33 + local_1d4 * fVar22) * fVar41;
            fVar30 = fVar30 * fVar30;
            fStack_94 = local_98;
            fStack_90 = local_98;
            fStack_8c = local_98;
            fVar22 = computeLodFromDerivates
                               (params->lodMode,
                                ((float)local_138._0_4_ *
                                (fVar37 * (fVar28 - fVar32) * local_98 +
                                fVar23 * (fVar22 * 0.0 + (fVar32 - fVar29) * fVar41))) / fVar24,
                                ((local_1e4 * fVar37 + (local_1e8 + local_1d0 * fVar41) * fVar23) *
                                (float)local_138._0_4_) / fVar24,
                                (((fVar5 - fVar4) * local_98 * fVar37 +
                                 ((fVar6 - fVar5) * fVar22 + (fVar4 - fVar6) * fVar41) * fVar23) *
                                (float)local_138._0_4_) / fVar24,
                                (((float)local_1c8._0_4_ * fVar49 +
                                 (local_1cc * fVar41 + local_1e0) * fVar33) * fVar47) / fVar30,
                                (((fVar2 - fVar3) * fVar22 * fVar49 +
                                 ((fVar3 - fVar1) * fVar41 + local_1dc) * fVar33) * fVar47) / fVar30
                                ,(((fVar5 - fVar6) * fVar22 * fVar49 +
                                  ((fVar6 - fVar4) * fVar41 + local_1d8) * fVar33) * fVar47) /
                                 fVar30);
            tcu::sampleLevelArray3D
                      ((tcu *)&local_48,pCVar16,iVar20,sampler,(float)local_1b8._0_4_,
                       (float)local_108._0_4_,(float)local_118._0_4_,fVar22 + local_280);
            fVar22 = (params->super_RenderParams).colorScale.m_data[0] * local_48 +
                     (params->super_RenderParams).colorBias.m_data[0];
            fVar28 = (params->super_RenderParams).colorScale.m_data[1] * fStack_44 +
                     (params->super_RenderParams).colorBias.m_data[1];
            fVar29 = (params->super_RenderParams).colorScale.m_data[2] * fStack_40 +
                     (params->super_RenderParams).colorBias.m_data[2];
            fVar32 = (params->super_RenderParams).colorScale.m_data[3] * fStack_3c +
                     (params->super_RenderParams).colorBias.m_data[3];
            bVar8 = dst->m_colorMask;
            uVar12 = 0;
            uVar21 = 0;
            if ((bVar8 & 1) != 0) {
              uVar13 = 0x7e - ((int)fVar22 >> 0x17);
              uVar21 = (((uint)fVar22 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar21 = uVar13;
              }
              uVar21 = uVar21 >> 0x18;
            }
            if ((bVar8 & 2) != 0) {
              uVar13 = 0x7e - ((int)fVar28 >> 0x17);
              uVar12 = (((uint)fVar28 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar12 = uVar13;
              }
              uVar12 = uVar12 >> 0x10 & 0xff00;
            }
            uVar13 = 0;
            if ((bVar8 & 4) != 0) {
              uVar14 = 0x7e - ((int)fVar29 >> 0x17);
              uVar13 = (((uint)fVar29 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar14 & 0x1f)) +
                       0x800000;
              if (8 < uVar14) {
                uVar13 = uVar14;
              }
              uVar13 = uVar13 >> 8 & 0xff0000;
            }
            uVar14 = 0xff000000;
            if ((bVar8 & 8) != 0) {
              uVar15 = 0x7e - ((int)fVar32 >> 0x17);
              uVar14 = (((uint)fVar32 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                       0x800000;
              if (8 < uVar15) {
                uVar14 = uVar15;
              }
              uVar14 = uVar14 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)(dst->m_x + iVar17 + (dst->m_y + iVar19) * dst->m_surface->m_width) * 4)
                 = uVar12 | uVar21 | uVar13 | uVar14;
            iVar17 = iVar17 + 1;
            iVar18 = dst->m_width;
            fVar22 = local_1ec;
          } while (iVar17 < iVar18);
          iVar17 = dst->m_height;
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 < iVar17);
    }
  }
  if (local_1a8.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture3DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture3DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4				rq		= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, tq, rq, params);
	else
		sampleTextureNonProjected(dst, view, sq, tq, rq, params);
}